

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_base.h
# Opt level: O0

void __thiscall
FFT::BaseComplexData<kiss_fft_cpx>::resize
          (BaseComplexData<kiss_fft_cpx> *this,uint32_t width_,uint32_t height_)

{
  uint32_t in_EDX;
  uint32_t in_ESI;
  BaseComplexData<kiss_fft_cpx> *in_RDI;
  uint32_t size;
  
  if ((((in_RDI->_width != in_ESI) || (in_RDI->_height != in_EDX)) && (in_ESI != 0)) &&
     (in_EDX != 0)) {
    _clean(in_RDI);
    (*in_RDI->_vptr_BaseComplexData[2])(in_RDI,(ulong)(in_ESI * in_EDX) << 3);
    in_RDI->_width = in_ESI;
    in_RDI->_height = in_EDX;
  }
  return;
}

Assistant:

void resize( uint32_t width_, uint32_t height_ )
        {
            if ( (_width != width_ || _height != height_) && width_ != 0 && height_ != 0 )
            {
                _clean();

                const uint32_t size = width_ * height_;
                _allocateData( size * sizeof( DataType ) );

                _width = width_;
                _height = height_;
            }
        }